

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

void lha_crc16_init(void)

{
  ushort local_12;
  int local_10;
  uint uStack_c;
  uint16_t crc;
  uint j;
  uint i;
  
  if (lha_crc16_init::crc16init == L'\0') {
    lha_crc16_init::crc16init = L'\x01';
    for (uStack_c = 0; uStack_c < 0x100; uStack_c = uStack_c + 1) {
      local_12 = (ushort)uStack_c;
      for (local_10 = 8; local_10 != 0; local_10 = local_10 + -1) {
        local_12 = (ushort)((int)(uint)local_12 >> 1) ^ (local_12 & 1) * -0x5fff;
      }
      crc16tbl[0][uStack_c] = local_12;
    }
    for (uStack_c = 0; uStack_c < 0x100; uStack_c = uStack_c + 1) {
      crc16tbl[1][uStack_c] =
           crc16tbl[0][uStack_c] >> 8 ^ crc16tbl[0][(int)(crc16tbl[0][uStack_c] & 0xff)];
    }
  }
  return;
}

Assistant:

static void
lha_crc16_init(void)
{
	unsigned int i;
	static int crc16init = 0;

	if (crc16init)
		return;
	crc16init = 1;

	for (i = 0; i < 256; i++) {
		unsigned int j;
		uint16_t crc = (uint16_t)i;
		for (j = 8; j; j--)
			crc = (crc >> 1) ^ ((crc & 1) * 0xA001);
		crc16tbl[0][i] = crc;
	}

	for (i = 0; i < 256; i++) {
		crc16tbl[1][i] = (crc16tbl[0][i] >> 8)
			^ crc16tbl[0][crc16tbl[0][i] & 0xff];
	}
}